

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* testing::GetReservedAttributesForElement
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *xml_element)

{
  int iVar1;
  allocator_type *__a;
  undefined1 *__last;
  undefined1 *__first;
  allocator_type local_17;
  allocator_type local_16;
  allocator_type local_15;
  GTestLog local_14;
  
  iVar1 = std::__cxx11::string::compare((char *)xml_element);
  if (iVar1 == 0) {
    __first = kReservedTestSuitesAttributes;
    __last = kReservedTestSuiteAttributes;
    __a = &local_17;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)xml_element);
    if (iVar1 == 0) {
      __first = kReservedTestSuiteAttributes;
      __last = kReservedTestCaseAttributes;
      __a = &local_16;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)xml_element);
      if (iVar1 != 0) {
        internal::GTestLog::GTestLog
                  (&local_14,GTEST_FATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/external/googletest/googletest/src/gtest.cc"
                   ,0x849);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Condition false failed. ",0x18);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Unrecognized xml_element provided: ",0x23);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,(xml_element->_M_dataplus)._M_p,
                   xml_element->_M_string_length);
        internal::GTestLog::~GTestLog(&local_14);
        (__return_storage_ptr__->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (__return_storage_ptr__->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (__return_storage_ptr__->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        return __return_storage_ptr__;
      }
      __first = kReservedTestCaseAttributes;
      __last = &DAT_001ffa50;
      __a = &local_15;
    }
  }
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  vector<char_const*const*,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,(char **)__first,(char **)__last,__a);
  return __return_storage_ptr__;
}

Assistant:

static std::vector<std::string> GetReservedAttributesForElement(
    const std::string& xml_element) {
  if (xml_element == "testsuites") {
    return ArrayAsVector(kReservedTestSuitesAttributes);
  } else if (xml_element == "testsuite") {
    return ArrayAsVector(kReservedTestSuiteAttributes);
  } else if (xml_element == "testcase") {
    return ArrayAsVector(kReservedTestCaseAttributes);
  } else {
    GTEST_CHECK_(false) << "Unrecognized xml_element provided: " << xml_element;
  }
  // This code is unreachable but some compilers may not realizes that.
  return std::vector<std::string>();
}